

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O1

void little_endian_to_native(void *data,char *format)

{
  char cVar1;
  char *pcVar2;
  
  cVar1 = *format;
  if (cVar1 != '\0') {
    pcVar2 = format + 1;
    do {
      if ((cVar1 != 'S') && (cVar1 != 'L')) {
        __ctype_b_loc();
      }
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

void little_endian_to_native (void *data, char *format)
{
    uchar *cp = (uchar *) data;
    int32_t temp;

    while (*format) {
        switch (*format) {
            case 'L':
                temp = cp [0] + ((int32_t) cp [1] << 8) + ((int32_t) cp [2] << 16) + ((int32_t) cp [3] << 24);
                * (int32_t *) cp = temp;
                cp += 4;
                break;

            case 'S':
                temp = cp [0] + (cp [1] << 8);
                * (short *) cp = (short) temp;
                cp += 2;
                break;

            default:
                if (isdigit (*format))
                    cp += *format - '0';

                break;
        }

        format++;
    }
}